

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O2

void __thiscall xe::xml::Tokenizer::getString(Tokenizer *this,string *dst)

{
  long lVar1;
  
  std::__cxx11::string::resize((ulong)dst);
  for (lVar1 = 0; lVar1 < this->m_curTokenLen + -2; lVar1 = lVar1 + 1) {
    (dst->_M_dataplus)._M_p[lVar1] =
         (this->m_buf).m_buffer[((this->m_buf).m_back + (int)lVar1 + 1) % (this->m_buf).m_size];
  }
  return;
}

Assistant:

void Tokenizer::getString (std::string& dst) const
{
	DE_ASSERT(m_curToken == TOKEN_STRING);
	dst.resize(m_curTokenLen-2);
	for (int ndx = 0; ndx < m_curTokenLen-2; ndx++)
		dst[ndx] = m_buf.peekBack(ndx+1);
}